

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O1

void __thiscall
stateObservation::ZeroDelayObserver::setInput(ZeroDelayObserver *this,InputVector *u_k,uint k)

{
  uint uVar1;
  _Map_pointer ppMVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Matrix local_38;
  
  if ((this->super_ObserverBase).p_ != 0) {
    iVar3 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1b])();
    if ((char)iVar3 == '\0') {
      __assert_fail("checkInputVector(u_k) && \"The size of the input vector is incorrect\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                    ,0x3b,
                    "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                   );
    }
    ppMVar2 = (this->u_).v_.
              super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar5 = (long)ppMVar2 -
            (long)(this->u_).v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar4 = ((long)(this->u_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->u_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555;
    lVar6 = ((long)(this->u_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->u_).v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555;
    if (((int)(uVar5 >> 3) - (uint)(ppMVar2 != (_Map_pointer)0x0)) * 0x15 + (int)lVar6 + (int)lVar4
        == 0) {
      if (((0 < (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows) &&
          (0 < (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols)) && (uVar1 = (this->x_).k_, uVar1 != k - 1 && uVar1 != k)) {
        __assert_fail("(!x_.isSet() || x_.getTime()==k || x_.getTime()==k-1) && \"ERROR: The time is set incorrectly for the                           inputs (must be [current_time] or [current_time+1])\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                      ,0x45,
                      "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                     );
      }
    }
    else {
      lVar4 = lVar4 + lVar6 + (((long)uVar5 >> 3) - (ulong)(ppMVar2 != (_Map_pointer)0x0)) * 0x15;
      uVar1 = (this->u_).k_;
      iVar3 = (int)lVar4 + -1 + uVar1;
      if (lVar4 == 0) {
        iVar3 = 0;
      }
      if ((iVar3 != k - 1) && (((lVar4 == 0 || (k < uVar1)) || (lVar4 + (ulong)uVar1 <= (ulong)k))))
      {
        __assert_fail("(u_.getLastIndex()==k-1 || u_.checkIndex(k)) && \"ERROR: The time is set incorrectly                                 for the inputs (order or gap)\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/zero-delay-observer.cpp"
                      ,0x40,
                      "virtual void stateObservation::ZeroDelayObserver::setInput(const ObserverBase::InputVector &, unsigned int)"
                     );
      }
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_38,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_k);
    IndexedMatrixArray::setValue(&this->u_,&local_38,k);
    free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
  }
  return;
}

Assistant:

void ZeroDelayObserver::setInput
                    (const ObserverBase::InputVector& u_k,unsigned k)
    {
        if (p_>0)
        {
            BOOST_ASSERT(checkInputVector(u_k)
                        && "The size of the input vector is incorrect");

            if (u_.size()>0)
                BOOST_ASSERT ((u_.getLastIndex()==k-1 || u_.checkIndex(k))
                        && "ERROR: The time is set incorrectly \
                                for the inputs (order or gap)");
            else
            {
                BOOST_ASSERT ( (!x_.isSet() || x_.getTime()==k || x_.getTime()==k-1)
                    && "ERROR: The time is set incorrectly for the \
                          inputs (must be [current_time] or [current_time+1])");
            }

            u_.setValue(u_k,k);
        }
    }